

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

void __thiscall
Assimp::STEP::InternGenericConvertList<Assimp::STEP::EXPRESS::PrimitiveDataType<long>,_3UL,_3UL>::
operator()(InternGenericConvertList<Assimp::STEP::EXPRESS::PrimitiveDataType<long>,_3UL,_3UL> *this,
          ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<long>,_3UL,_3UL> *out,
          shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *inp_base,DB *db)

{
  element_type *peVar1;
  pointer plVar2;
  long lVar3;
  ulong uVar4;
  Logger *this_00;
  TypeError *this_01;
  long lVar5;
  char *message;
  InternGenericConvert<long> local_71;
  undefined1 local_70 [64];
  
  peVar1 = (inp_base->
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(peVar1,&EXPRESS::DataType::typeinfo,&EXPRESS::LIST::typeinfo,0);
  }
  if (lVar3 == 0) {
    this_01 = (TypeError *)__cxa_allocate_exception(0x10);
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"type error reading aggregate","");
    TypeError::TypeError(this_01,(string *)local_70,0xffffffffffffffff,0xffffffffffffffff);
    __cxa_throw(this_01,&TypeError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar4 = *(long *)(lVar3 + 0x10) - *(long *)(lVar3 + 8);
  if (uVar4 < 0x31) {
    if (uVar4 == 0x30) goto LAB_005c2ef2;
    message = "too few aggregate elements";
  }
  else {
    message = "too many aggregate elements";
  }
  this_00 = DefaultLogger::get();
  Logger::warn(this_00,message);
LAB_005c2ef2:
  std::vector<long,_std::allocator<long>_>::reserve
            (&out->super_vector<long,_std::allocator<long>_>,
             *(long *)(lVar3 + 0x10) - *(long *)(lVar3 + 8) >> 4);
  if (*(long *)(lVar3 + 0x10) != *(long *)(lVar3 + 8)) {
    lVar5 = 8;
    uVar4 = 0;
    do {
      local_70._0_8_ = (element_type *)0x0;
      std::vector<long,_std::allocator<long>_>::emplace_back<long>
                (&out->super_vector<long,_std::allocator<long>_>,(long *)local_70);
      plVar2 = (out->super_vector<long,_std::allocator<long>_>).
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      local_70._0_8_ = *(undefined8 *)(*(long *)(lVar3 + 8) + -8 + lVar5);
      local_70._8_8_ = *(long *)(*(long *)(lVar3 + 8) + lVar5);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count + 1;
        }
      }
      InternGenericConvert<long>::operator()
                (&local_71,plVar2 + -1,(shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70
                 ,db);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < (ulong)(*(long *)(lVar3 + 0x10) - *(long *)(lVar3 + 8) >> 4));
  }
  return;
}

Assistant:

void operator()(ListOf<T, min_cnt, max_cnt>& out, const std::shared_ptr< const EXPRESS::DataType >& inp_base, const STEP::DB& db) {

            const EXPRESS::LIST* inp = dynamic_cast<const EXPRESS::LIST*>(inp_base.get());
            if (!inp) {
                throw TypeError("type error reading aggregate");
            }

            // XXX is this really how the EXPRESS notation ([?:3],[1:3]) is intended?
            if (max_cnt && inp->GetSize() > max_cnt) {
                ASSIMP_LOG_WARN("too many aggregate elements");
            }
            else if (inp->GetSize() < min_cnt) {
                ASSIMP_LOG_WARN("too few aggregate elements");
            }

            out.reserve(inp->GetSize());
            for(size_t i = 0; i < inp->GetSize(); ++i) {

                out.push_back( typename ListOf<T, min_cnt, max_cnt>::OutScalar() );
                try{
                    GenericConvert(out.back(),(*inp)[i], db);
                }
                catch(const TypeError& t) {
                    throw TypeError(t.what() +std::string(" of aggregate"));
                }
            }
        }